

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_by_name.c
# Opt level: O0

int archive_write_add_filter_by_name(archive *a,char *name)

{
  int iVar1;
  char *in_RSI;
  archive *in_RDI;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (names[local_1c].name == (char *)0x0) {
      archive_set_error(in_RDI,0x16,"No such filter \'%s\'",in_RSI);
      in_RDI->state = 0x8000;
      return -0x1e;
    }
    iVar1 = strcmp(in_RSI,names[local_1c].name);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  iVar1 = (*names[local_1c].setter)(in_RDI);
  return iVar1;
}

Assistant:

int
archive_write_add_filter_by_name(struct archive *a, const char *name)
{
	int i;

	for (i = 0; names[i].name != NULL; i++) {
		if (strcmp(name, names[i].name) == 0)
			return ((names[i].setter)(a));
	}

	archive_set_error(a, EINVAL, "No such filter '%s'", name);
	a->state = ARCHIVE_STATE_FATAL;
	return (ARCHIVE_FATAL);
}